

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

bool tryParseNumber(char *str,uint32_t *number)

{
  int iVar1;
  uint32_t *puVar2;
  byte local_23;
  byte local_21;
  uint8_t digit;
  char chr;
  uint8_t base;
  uint32_t *number_local;
  char *str_local;
  
  local_21 = 10;
  number_local = (uint32_t *)str;
  if (*str == '$') {
    number_local = (uint32_t *)(str + 1);
    local_21 = 0x10;
  }
  if ((char)*number_local == '\0') {
    str_local._7_1_ = false;
  }
  else {
    *number = 0;
    do {
      puVar2 = (uint32_t *)((long)number_local + 1);
      iVar1 = toupper((int)(char)*number_local);
      for (local_23 = 0; (local_23 < local_21 && ((char)iVar1 != "0123456789ABCDEF"[local_23]));
          local_23 = local_23 + 1) {
      }
      if (local_23 == local_21) {
        return false;
      }
      *number = *number * (uint)local_21 + (uint)local_23;
      number_local = puVar2;
    } while (*(char *)puVar2 != '\0');
    str_local._7_1_ = true;
  }
  return str_local._7_1_;
}

Assistant:

static bool tryParseNumber(char const *str, uint32_t *number)
{
	static char const digits[] = {
		'0', '1', '2', '3', '4', '5', '6', '7', '8', '9',
		'A', 'B', 'C', 'D', 'E', 'F'
	};
	uint8_t base = 10;

	if (*str == '$') {
		str++;
		base = 16;
	}

	// An empty string is not a number
	if (!*str)
		return false;

	*number = 0;
	do {
		char chr = toupper(*str++);
		uint8_t digit = 0;

		while (digit < base) {
			if (chr == digits[digit])
				break;
			digit++;
		}
		if (digit == base)
			return false;
		*number = *number * base + digit;
	} while (*str);

	return true;
}